

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hypergraph.cpp
# Opt level: O3

void __thiscall Hypergraph::Hypergraph(Hypergraph *this,Hypergraph *other)

{
  (this->m_edges).
  super__Vector_base<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_edges).
  super__Vector_base<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_edges).
  super__Vector_base<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_configuration).name._M_dataplus._M_p = (pointer)&(this->m_configuration).name.field_2;
  (this->m_configuration).name._M_string_length = 0;
  (this->m_configuration).name.field_2._M_local_buf[0] = '\0';
  (this->m_configuration).implementation._M_dataplus._M_p =
       (pointer)&(this->m_configuration).implementation.field_2;
  (this->m_configuration).implementation._M_string_length = 0;
  (this->m_configuration).implementation.field_2._M_local_buf[0] = '\0';
  (this->m_configuration).statistics_directory.m_pathname._M_dataplus._M_p =
       (pointer)&(this->m_configuration).statistics_directory.m_pathname.field_2;
  (this->m_configuration).statistics_directory.m_pathname._M_string_length = 0;
  (this->m_configuration).statistics_directory.m_pathname.field_2._M_local_buf[0] = '\0';
  Table::Table(&this->m_hitting_set_stats);
  Table::Table(&this->m_oracle_stats);
  (this->m_hitting_set_timestamp).__d.__r = 0;
  (this->m_oracle_timestamp).__d.__r = 0;
  (this->m_oracle_bf_timestamp).__d.__r = 0;
  std::
  vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::operator=(&this->m_edges,&other->m_edges);
  this->m_num_vertices = other->m_num_vertices;
  return;
}

Assistant:

Hypergraph::Hypergraph(const Hypergraph &other) {
	m_edges = other.m_edges;
	m_num_vertices = other.m_num_vertices;
}